

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall
QXmlStreamWriterPrivate::writeStartElement
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,QAnyStringView name,
          StartElementOption option)

{
  qsizetype *pqVar1;
  Tag *pTVar2;
  ulong uVar3;
  QString *pQVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  bool bVar9;
  long lVar10;
  Tag *pTVar11;
  NamespaceDeclaration *pNVar12;
  char16_t *pcVar13;
  long lVar14;
  size_t __n;
  void *pvVar15;
  int iVar16;
  long lVar17;
  long in_FS_OFFSET;
  XmlStringRef local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = finishStartElement(this,false);
  if ((!bVar9) && ((this->field_0x78 & 0x80) != 0)) {
    indent(this,(int)(this->super_QXmlStreamPrivateTagStack).tagStack.tos + 1);
  }
  lVar14 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos;
  lVar17 = (this->super_QXmlStreamPrivateTagStack).tagStack.cap;
  if (lVar17 <= lVar14 + 1) {
    lVar14 = lVar14 + 2;
    lVar10 = lVar17 * 2;
    if (lVar14 != lVar10 && SBORROW8(lVar14,lVar10) == lVar14 + lVar17 * -2 < 0) {
      lVar10 = lVar14;
    }
    (this->super_QXmlStreamPrivateTagStack).tagStack.cap = lVar10;
    pTVar11 = (Tag *)realloc((this->super_QXmlStreamPrivateTagStack).tagStack.data,lVar10 * 0x70);
    (this->super_QXmlStreamPrivateTagStack).tagStack.data = pTVar11;
    if (pTVar11 == (Tag *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_003a4c34;
    }
  }
  pTVar2 = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  lVar14 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos + 1;
  (this->super_QXmlStreamPrivateTagStack).tagStack.tos = lVar14;
  pTVar11 = pTVar2 + lVar14;
  pqVar1 = &pTVar2[lVar14].namespaceDeclaration.namespaceUri.m_pos;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pqVar1 = &pTVar2[lVar14].namespaceDeclaration.prefix.m_size;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pTVar2[lVar14].namespaceDeclaration.prefix.m_string = (QString *)0x0;
  pTVar2[lVar14].namespaceDeclaration.prefix.m_pos = 0;
  pqVar1 = &pTVar2[lVar14].qualifiedName.m_pos;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pqVar1 = &pTVar2[lVar14].name.m_size;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pTVar2[lVar14].name.m_string = (QString *)0x0;
  pTVar2[lVar14].name.m_pos = 0;
  pTVar2[lVar14].tagStackStringStorageSize =
       (this->super_QXmlStreamPrivateTagStack).tagStackStringStorageSize;
  pTVar2[lVar14].namespaceDeclarationsSize =
       (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_50,&this->super_QXmlStreamPrivateTagStack,name);
  pTVar2[lVar14].name.m_size = local_50.m_size;
  pTVar2[lVar14].name.m_string = local_50.m_string;
  pTVar2[lVar14].name.m_pos = local_50.m_pos;
  __n = 0;
  pNVar12 = findNamespace(this,namespaceUri,false,false);
  qVar5 = (pNVar12->prefix).m_pos;
  qVar6 = (pNVar12->prefix).m_size;
  pQVar4 = (pNVar12->namespaceUri).m_string;
  qVar7 = (pNVar12->namespaceUri).m_pos;
  qVar8 = (pNVar12->namespaceUri).m_size;
  pTVar2[lVar14].namespaceDeclaration.prefix.m_string = (pNVar12->prefix).m_string;
  pTVar2[lVar14].namespaceDeclaration.prefix.m_pos = qVar5;
  pqVar1 = &pTVar2[lVar14].namespaceDeclaration.prefix.m_size;
  *pqVar1 = qVar6;
  pqVar1[1] = (qsizetype)pQVar4;
  pqVar1 = &pTVar2[lVar14].namespaceDeclaration.namespaceUri.m_pos;
  *pqVar1 = qVar7;
  pqVar1[1] = qVar8;
  write(this,0x5b71f5,(void *)0x1,__n);
  uVar3 = pTVar2[lVar14].namespaceDeclaration.prefix.m_size;
  if (uVar3 != 0) {
    pQVar4 = pTVar2[lVar14].namespaceDeclaration.prefix.m_string;
    if (pQVar4 == (QString *)0x0) {
      iVar16 = 0;
      pvVar15 = (void *)0x8000000000000000;
    }
    else {
      pcVar13 = (pQVar4->d).ptr;
      if (pcVar13 == (char16_t *)0x0) {
        pcVar13 = L"";
      }
      __n = (pTVar11->namespaceDeclaration).prefix.m_pos;
      iVar16 = (int)pcVar13 + (int)__n * 2;
      pvVar15 = (void *)(uVar3 | 0x8000000000000000);
    }
    write(this,iVar16,pvVar15,__n);
    write(this,0x4e7c0c,(void *)0x1,__n);
  }
  pQVar4 = (pTVar11->name).m_string;
  if (pQVar4 == (QString *)0x0) {
    iVar16 = 0;
  }
  else {
    pcVar13 = (pQVar4->d).ptr;
    if (pcVar13 == (char16_t *)0x0) {
      pcVar13 = L"";
    }
    iVar16 = (int)pcVar13 + (int)(pTVar11->name).m_pos * 2;
  }
  pvVar15 = (void *)((pTVar11->name).m_size | 0x8000000000000000);
  if (pQVar4 == (QString *)0x0) {
    pvVar15 = (void *)0x8000000000000000;
  }
  write(this,iVar16,pvVar15,0x8000000000000000);
  this->field_0x78 = this->field_0x78 | 10;
  if ((option != OmitNamespaceDeclarations) &&
     (lVar14 = this->lastNamespaceDeclaration,
     lVar14 <= (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos)) {
    lVar17 = lVar14 + -1;
    lVar14 = lVar14 * 0x30;
    do {
      writeNamespaceDeclaration
                (this,(NamespaceDeclaration *)
                      ((long)&(((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data)
                              ->prefix).m_string + lVar14));
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + 0x30;
    } while (lVar17 < (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos);
  }
  pTVar11->namespaceDeclarationsSize = this->lastNamespaceDeclaration;
  this->field_0x79 = this->field_0x79 | 2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003a4c34:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::writeStartElement(QAnyStringView namespaceUri, QAnyStringView name,
                                                StartElementOption option)
{
    if (!finishStartElement(false) && autoFormatting)
        indent(tagStack.size());

    Tag &tag = tagStack_push();
    tag.name = addToStringStorage(name);
    tag.namespaceDeclaration = findNamespace(namespaceUri);
    write("<");
    if (!tag.namespaceDeclaration.prefix.isEmpty()) {
        write(tag.namespaceDeclaration.prefix);
        write(":");
    }
    write(tag.name);
    inStartElement = lastWasStartElement = true;

    if (option != StartElementOption::OmitNamespaceDeclarations) {
        for (qsizetype i = lastNamespaceDeclaration; i < namespaceDeclarations.size(); ++i)
            writeNamespaceDeclaration(namespaceDeclarations[i]);
    }
    tag.namespaceDeclarationsSize = lastNamespaceDeclaration;
    didWriteAnyToken = true;
}